

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

UniquePtr<GENERAL_NAME> __thiscall
anon_unknown.dwarf_52317d::MakeGeneralName(anon_unknown_dwarf_52317d *this,int type,string *value)

{
  bool bVar1;
  int iVar2;
  ASN1_IA5STRING *__p;
  GENERAL_NAME *__p_00;
  pointer paVar3;
  void *_data;
  ossl_ssize_t len_s;
  pointer pGVar4;
  unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter> local_30;
  UniquePtr<GENERAL_NAME> name;
  UniquePtr<ASN1_IA5STRING> str;
  string *value_local;
  int type_local;
  
  if (((type != 1) && (type != 2)) && (type != 6)) {
    std::unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
  }
  __p = ASN1_IA5STRING_new();
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&name,(pointer)__p);
  __p_00 = GENERAL_NAME_new();
  std::unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter> *)&local_30,(pointer)__p_00);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&name);
  if ((bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30), bVar1)) {
    paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&name);
    _data = (void *)std::__cxx11::string::data();
    len_s = std::__cxx11::string::size();
    iVar2 = ASN1_STRING_set(paVar3,_data,len_s);
    if (iVar2 != 0) {
      pGVar4 = std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::operator->(&local_30);
      pGVar4->type = type;
      paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::release
                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&name);
      pGVar4 = std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::operator->(&local_30);
      (pGVar4->d).otherName = (OTHERNAME *)paVar3;
      std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter> *)this,&local_30);
      goto LAB_005ab26d;
    }
  }
  std::unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<GENERAL_NAME_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_005ab26d:
  std::unique_ptr<GENERAL_NAME_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&name);
  return (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<GENERAL_NAME_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<GENERAL_NAME> MakeGeneralName(int type,
                                                     const std::string &value) {
  if (type != GEN_EMAIL && type != GEN_DNS && type != GEN_URI) {
    // This function only supports the IA5String types.
    return nullptr;
  }
  bssl::UniquePtr<ASN1_IA5STRING> str(ASN1_IA5STRING_new());
  bssl::UniquePtr<GENERAL_NAME> name(GENERAL_NAME_new());
  if (!str || !name ||
      !ASN1_STRING_set(str.get(), value.data(), value.size())) {
    return nullptr;
  }

  name->type = type;
  name->d.ia5 = str.release();
  return name;
}